

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *ws;
  uint *puVar1;
  long lVar2;
  uint uVar3;
  ZSTD_cwksp *pZVar4;
  ZSTD_cwksp *pZVar5;
  ulong uVar6;
  void *alloc;
  ulong uVar7;
  byte bVar8;
  ZSTD_cwksp local_68;
  
  bVar8 = 0;
  if (((ulong)workspace & 7) == 0 && 0x1478 < workspaceSize) {
    local_68.workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_68.allocStart = (void *)((ulong)local_68.workspaceEnd & 0xffffffffffffffc0);
    local_68.phase = ZSTD_cwksp_alloc_objects;
    local_68.isStatic = ZSTD_cwksp_static_alloc;
    local_68.allocFailed = '\0';
    local_68.workspace = workspace;
    local_68.objectEnd = workspace;
    local_68.tableEnd = workspace;
    local_68.tableValidEnd = workspace;
    local_68.initOnceStart = local_68.allocStart;
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    local_68.workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    if ((0x1477 < (long)workspaceSize) &&
       (local_68.objectEnd = (void *)((long)workspace + 0x1478), workspace != (void *)0x0)) {
      local_68.tableEnd = local_68.objectEnd;
      local_68.tableValidEnd = local_68.objectEnd;
      memset(workspace,0,0x1478);
      ws = (ZSTD_cwksp *)((long)workspace + 0x290);
      pZVar4 = &local_68;
      pZVar5 = ws;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pZVar5->workspace = pZVar4->workspace;
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + ((ulong)bVar8 * -2 + 1) * 8);
        pZVar5 = (ZSTD_cwksp *)((long)pZVar5 + (ulong)bVar8 * -0x10 + 8);
      }
      *(size_t *)((long)workspace + 0x370) = workspaceSize;
      if (0x4ed7 < (ulong)(*(long *)((long)workspace + 0x2b8) - *(long *)((long)workspace + 0x2a8)))
      {
        uVar6 = *(ulong *)((long)workspace + 0x2a0);
        if ((uVar6 & 7) == 0) {
          ZSTD_cwksp_assert_internal_consistency(ws);
          if ((*(int *)((long)workspace + 0x2d0) == 0) &&
             (uVar7 = uVar6 + 0x1600, uVar7 <= *(ulong *)((long)workspace + 0x298))) {
            *(ulong *)((long)workspace + 0x2a0) = uVar7;
            *(ulong *)((long)workspace + 0x2a8) = uVar7;
            *(ulong *)((long)workspace + 0x2b0) = uVar7;
          }
          else {
            *(undefined1 *)((long)workspace + 0x2c8) = 1;
            uVar7 = *(ulong *)((long)workspace + 0x2a0);
            uVar6 = 0;
          }
          *(ulong *)((long)workspace + 0xc68) = uVar6;
          if ((uVar7 & 7) == 0) {
            ZSTD_cwksp_assert_internal_consistency(ws);
            if ((*(int *)((long)workspace + 0x2d0) == 0) &&
               (uVar6 = uVar7 + 0x1600, uVar6 <= *(ulong *)((long)workspace + 0x298))) {
              *(ulong *)((long)workspace + 0x2a0) = uVar6;
              *(ulong *)((long)workspace + 0x2a8) = uVar6;
              *(ulong *)((long)workspace + 0x2b0) = uVar6;
            }
            else {
              *(undefined1 *)((long)workspace + 0x2c8) = 1;
              uVar6 = *(ulong *)((long)workspace + 0x2a0);
              uVar7 = 0;
            }
            *(ulong *)((long)workspace + 0xc70) = uVar7;
            if ((uVar6 & 7) == 0) {
              ZSTD_cwksp_assert_internal_consistency(ws);
              if ((*(int *)((long)workspace + 0x2d0) == 0) &&
                 (uVar7 = uVar6 + 0x22d8, uVar7 <= *(ulong *)((long)workspace + 0x298))) {
                *(ulong *)((long)workspace + 0x2a0) = uVar7;
                *(ulong *)((long)workspace + 0x2a8) = uVar7;
                *(ulong *)((long)workspace + 0x2b0) = uVar7;
              }
              else {
                *(undefined1 *)((long)workspace + 0x2c8) = 1;
                uVar6 = 0;
              }
              *(ulong *)((long)workspace + 0xda8) = uVar6;
              puVar1 = (uint *)cpuid_basic_info(0);
              uVar3 = 0;
              if ((*puVar1 != 0) && (uVar3 = 0, 6 < *puVar1)) {
                lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
                uVar3 = *(uint *)(lVar2 + 4) >> 8 & 1;
              }
              *(uint *)((long)workspace + 8) = uVar3;
              return (ZSTD_CCtx *)workspace;
            }
          }
        }
        __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                      ,0x1f2,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}